

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multiqueues.h
# Opt level: O0

int __thiscall Multiqueues<int>::getTopValue(Multiqueues<int> *this,int queueIndex)

{
  bool bVar1;
  value_type *pvVar2;
  int topValue;
  undefined4 local_10;
  
  local_10 = -1;
  bVar1 = boost::heap::
          d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
          ::empty((d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
                   *)0x105a63);
  if (!bVar1) {
    pvVar2 = boost::heap::
             d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
             ::top((d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
                    *)0x105a80);
    local_10 = *pvVar2;
    boost::heap::
    d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
    ::pop((d_ary_heap<int,_boost::heap::mutable_<true>,_boost::heap::arity<2U>,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_,_boost::parameter::void_>
           *)0x105aa2);
  }
  std::mutex::unlock((mutex *)0x105abb);
  return local_10;
}

Assistant:

T getTopValue(const int queueIndex) const {
        int topValue = -1;
        if (!internalQueues[queueIndex].empty()) {
            topValue = internalQueues[queueIndex].top();
            internalQueues[queueIndex].pop();
        }
        locks[queueIndex].unlock();
        return topValue;
    }